

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void Js::JavascriptBigInt::Increment(JavascriptBigInt *pbi)

{
  unsigned_long **ppuVar1;
  JavascriptBigInt *result;
  JavascriptBigInt *pbi_local;
  
  if ((pbi->m_isNegative & 1U) == 0) {
    AbsoluteIncrement(pbi);
  }
  else {
    if ((pbi->m_length == 1) &&
       (ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&pbi->m_digits), **ppuVar1 == 1)) {
      ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&pbi->m_digits);
      **ppuVar1 = 0;
      pbi->m_isNegative = false;
      return;
    }
    AbsoluteDecrement(pbi);
  }
  return;
}

Assistant:

void JavascriptBigInt::Increment(JavascriptBigInt * pbi)
    {
        if (pbi->m_isNegative)
        {
            // return 0n for -1n
            if (pbi->m_length == 1 && pbi->m_digits[0] == 1)
            {
                JavascriptBigInt* result = pbi;
                result->m_digits[0] = 0;
                result->m_isNegative = false;
                return;
            }
            return JavascriptBigInt::AbsoluteDecrement(pbi);
        }
        return JavascriptBigInt::AbsoluteIncrement(pbi);
    }